

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.h
# Opt level: O3

void __thiscall CP::list<int>::replace(list<int> *this,int *x,list<int> *y)

{
  int iVar1;
  node *pnVar2;
  node *pnVar3;
  node *pnVar4;
  node *pnVar5;
  iterator tmp;
  node *pnVar6;
  size_t sVar7;
  
  pnVar6 = this->mHeader->next;
  if (this->mHeader != pnVar6) {
    do {
      pnVar2 = pnVar6->next;
      if (pnVar6->data == *x) {
        pnVar5 = pnVar6->prev;
        pnVar5->next = pnVar2;
        pnVar2->prev = pnVar5;
        operator_delete(pnVar6,0x18);
        sVar7 = this->mSize;
        this->mSize = sVar7 - 1;
        pnVar6 = y->mHeader;
        for (pnVar5 = pnVar6->next; pnVar6 != pnVar5; pnVar5 = pnVar5->next) {
          iVar1 = pnVar5->data;
          pnVar4 = (node *)operator_new(0x18);
          pnVar3 = pnVar2->prev;
          pnVar4->data = iVar1;
          pnVar4->prev = pnVar3;
          pnVar4->next = pnVar2;
          pnVar3->next = pnVar4;
          pnVar2->prev = pnVar4;
          this->mSize = sVar7;
          sVar7 = sVar7 + 1;
        }
      }
      pnVar6 = pnVar2;
    } while (this->mHeader != pnVar2);
  }
  return;
}

Assistant:

void replace(const T &x, list<T> &y) {
    auto it = begin();
    while (it != end()) {
        if (*it == x) {
            it = erase(it);
            for (auto val : y) {
                insert(it, val);
            }
        } else {
            ++it;
        }
    }
}